

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.h
# Opt level: O1

void __thiscall Steiner::~Steiner(Steiner *this)

{
  pointer piVar1;
  pointer pEVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer pcVar5;
  
  piVar1 = (this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pEVar2 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar2 != (pointer)0x0) {
    operator_delete(pEVar2);
  }
  pEVar2 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar2 != (pointer)0x0) {
    operator_delete(pEVar2);
  }
  piVar1 = (this->_table_cnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  ptVar3 = (this->_table).
           super__Vector_base<std::tuple<int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar3 != (pointer)0x0) {
    operator_delete(ptVar3);
  }
  piVar1 = (this->_rank).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->_par).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->_ancestor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->_visit).super__Bvector_base<std::allocator<bool>_>);
  piVar1 = (this->_lca_answer_queries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  ptVar4 = (this->_lca_queries).
           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar4 != (pointer)0x0) {
    operator_delete(ptVar4);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->_lca_place);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->_edges_del).super__Bvector_base<std::allocator<bool>_>);
  piVar1 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->_set).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pEVar2 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar2 != (pointer)0x0) {
    operator_delete(pEVar2);
  }
  std::vector<Point,_std::allocator<Point>_>::~vector(&this->_points);
  pcVar5 = (this->_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &(this->_name).field_2) {
    operator_delete(pcVar5);
    return;
  }
  return;
}

Assistant:

~Steiner() {}